

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

char * INT_create_router_action_spec(FMStructDescList format_list,char *function)

{
  char **ppcVar1;
  FMStructDescList p_Var2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  
  if (format_list == (FMStructDescList)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0xffffffff;
    p_Var2 = format_list;
    do {
      uVar6 = uVar6 + 1;
      ppcVar1 = &p_Var2->format_name;
      p_Var2 = p_Var2 + 1;
    } while (*ppcVar1 != (char *)0x0);
  }
  pcVar3 = (char *)INT_CMmalloc(0x32);
  sprintf(pcVar3,"Router Action   Format Count %d\n",(ulong)uVar6);
  if (uVar6 != 0) {
    uVar7 = (ulong)uVar6;
    do {
      pcVar3 = add_FMfieldlist_to_string(pcVar3,format_list);
      format_list = format_list + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  sVar4 = strlen(pcVar3);
  sVar5 = strlen(function);
  pcVar3 = (char *)INT_CMrealloc(pcVar3,sVar4 + sVar5 + 1);
  sVar4 = strlen(pcVar3);
  strcpy(pcVar3 + sVar4,function);
  return pcVar3;
}

Assistant:

char *
INT_create_router_action_spec(FMStructDescList format_list, char *function)
{
    int format_count = 0;
    int i;
    char *str;
    while(format_list && (format_list[format_count].format_name != NULL)) format_count++;
    str = malloc(50);
    sprintf(str, "Router Action   Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &format_list[i]);
    }
    str = realloc(str, strlen(str) + strlen(function) + 1);
    strcpy(&str[strlen(str)], function);
    return str;
}